

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.hpp
# Opt level: O3

void __thiscall Options::~Options(Options *this)

{
  pointer paVar1;
  
  if ((this->input).super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
      super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
    (this->input).super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
    super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
    super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged = false;
    std::filesystem::__cxx11::path::~path((path *)&this->input);
  }
  if ((this->tilemap).super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
      super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
    (this->tilemap).super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
    super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
    super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged = false;
    std::filesystem::__cxx11::path::~path((path *)&this->tilemap);
  }
  if ((this->palmap).super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
      super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
    (this->palmap).super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
    super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
    super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged = false;
    std::filesystem::__cxx11::path::~path((path *)&this->palmap);
  }
  if ((this->palettes).super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload
      .super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
    (this->palettes).super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
    super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
    super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged = false;
    std::filesystem::__cxx11::path::~path((path *)&this->palettes);
  }
  if ((this->output).super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
      super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
    (this->output).super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
    super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
    super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged = false;
    std::filesystem::__cxx11::path::~path((path *)&this->output);
  }
  paVar1 = (this->palSpec).
           super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (paVar1 != (pointer)0x0) {
    operator_delete(paVar1,(long)(this->palSpec).
                                 super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar1);
  }
  if ((this->attrmap).super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
      super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
    (this->attrmap).super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
    super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
    super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged = false;
    std::filesystem::__cxx11::path::~path((path *)&this->attrmap);
    return;
  }
  return;
}

Assistant:

bool reverse() const { return reversedWidth != 0; }